

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::doJSONAttachments(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  _Atomic_word *p_Var1;
  variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  *__v;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  __index_type _Var3;
  undefined8 uVar4;
  QPDF_Dictionary *pQVar5;
  variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
  *pvVar6;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  string iso8601;
  QPDFEFStreamObjectHelper efs;
  JSON j_details;
  JSON j_stream;
  JSON j_names;
  JSON j_attachments;
  JSON j_streams;
  QPDFEmbeddedFileDocumentHelper efdh;
  undefined1 local_250 [32];
  string local_230;
  undefined1 local_210 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200 [2];
  QPDFFileSpecObjectHelper *local_1d8;
  string local_1d0;
  JSON local_1b0;
  _Base_ptr local_1a0;
  undefined1 local_198 [32];
  QPDFFileSpecObjectHelper local_178;
  string local_140;
  string local_120;
  JSON local_100;
  JSON local_f0;
  JSON local_e0;
  JSON local_d0;
  JSON local_c0;
  JSON local_b0;
  JSON local_a0;
  JSON local_90;
  QPDFEmbeddedFileDocumentHelper local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
  local_60;
  
  JSON::makeDictionary();
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper(&local_80,pdf);
  local_140.field_2._M_allocated_capacity = (size_type)p;
  local_140.field_2._8_8_ = first;
  QPDFEmbeddedFileDocumentHelper::getEmbeddedFiles_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
              *)&local_60,&local_80);
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    do {
      local_1d8 = *(QPDFFileSpecObjectHelper **)
                   (local_60._M_impl.super__Rb_tree_header._M_header._M_left + 2);
      local_1a0 = local_60._M_impl.super__Rb_tree_header._M_header._M_left[2]._M_parent;
      if (local_1a0 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&local_1a0->_M_parent = *(int *)&local_1a0->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&local_1a0->_M_parent = *(int *)&local_1a0->_M_parent + 1;
        }
      }
      local_178.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      JSON::makeDictionary();
      JSON::addDictionaryMember
                ((JSON *)local_198,&local_140,
                 (JSON *)(local_178.super_QPDFObjectHelper.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi + 2));
      if ((element_type *)local_210._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_);
      }
      local_210._0_8_ = local_200;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"filespec","");
      local_1d0._M_dataplus._M_p =
           (pointer)(local_1d8->super_QPDFObjectHelper).super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1d0._M_string_length =
           (size_type)
           (local_1d8->super_QPDFObjectHelper).super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length)->
                 _M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length)->
                 _M_use_count + 1;
        }
      }
      QPDFObjectHandle::unparse_abi_cxx11_(&local_230,(QPDFObjectHandle *)&local_1d0);
      JSON::makeString((JSON *)local_250,&local_230);
      JSON::addDictionaryMember(&local_90,(string *)local_198,(JSON *)local_210);
      if (local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._0_8_ != local_200) {
        operator_delete((void *)local_210._0_8_,local_200[0]._M_allocated_capacity + 1);
      }
      local_210._0_8_ = local_200;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"preferredname","");
      QPDFFileSpecObjectHelper::getFilename_abi_cxx11_(&local_230,local_1d8);
      JSON::makeString((JSON *)local_250,&local_230);
      JSON::addDictionaryMember(&local_a0,(string *)local_198,(JSON *)local_210);
      if (local_a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._0_8_ != local_200) {
        operator_delete((void *)local_210._0_8_,local_200[0]._M_allocated_capacity + 1);
      }
      local_210._0_8_ = local_200;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"preferredcontents","");
      local_250._0_8_ = local_250 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"");
      QPDFFileSpecObjectHelper::getEmbeddedFileStream(&local_178,(string *)local_1d8);
      QPDFObjectHandle::unparse_abi_cxx11_(&local_230,(QPDFObjectHandle *)&local_178);
      JSON::makeString((JSON *)&local_1d0,&local_230);
      JSON::addDictionaryMember(&local_b0,(string *)local_198,(JSON *)local_210);
      if (local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if (local_178.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_178.super_QPDFObjectHelper.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if ((element_type *)local_250._0_8_ != (element_type *)(local_250 + 0x10)) {
        operator_delete((void *)local_250._0_8_,CONCAT71(local_250._17_7_,local_250[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._0_8_ != local_200) {
        operator_delete((void *)local_210._0_8_,local_200[0]._M_allocated_capacity + 1);
      }
      local_210._0_8_ = local_200;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"description","");
      QPDFFileSpecObjectHelper::getDescription_abi_cxx11_(&local_230,local_1d8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        JSON::makeNull();
      }
      else {
        JSON::makeString((JSON *)local_250,&local_230);
      }
      JSON::addDictionaryMember(&local_c0,(string *)local_198,(JSON *)local_210);
      if (local_c0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._0_8_ != local_200) {
        operator_delete((void *)local_210._0_8_,local_200[0]._M_allocated_capacity + 1);
      }
      local_210._0_8_ = local_200;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"names","");
      JSON::makeDictionary();
      JSON::addDictionaryMember((JSON *)&local_178,(string *)local_198,(JSON *)local_210);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._0_8_ != local_200) {
        operator_delete((void *)local_210._0_8_,local_200[0]._M_allocated_capacity + 1);
      }
      QPDFFileSpecObjectHelper::getFilenames_abi_cxx11_
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_210,local_1d8);
      for (uVar4 = local_200[0]._8_8_;
          (_Rb_tree_node_base *)uVar4 != (_Rb_tree_node_base *)(local_210 + 8);
          uVar4 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar4)) {
        JSON::makeString((JSON *)&local_230,(string *)(uVar4 + 0x40));
        JSON::addDictionaryMember(&local_d0,(string *)&local_178,(JSON *)(uVar4 + 0x20));
        if (local_d0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_210);
      local_210._0_8_ = local_200;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"streams","");
      JSON::makeDictionary();
      JSON::addDictionaryMember((JSON *)&local_120,(string *)local_198,(JSON *)local_210);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._0_8_ != local_200) {
        operator_delete((void *)local_210._0_8_,local_200[0]._M_allocated_capacity + 1);
      }
      QPDFFileSpecObjectHelper::getEmbeddedFileStreams((QPDFFileSpecObjectHelper *)local_210);
      local_178.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_210._0_8_;
      local_178.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_;
      if ((element_type *)local_210._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (_Atomic_word *)
                   ((long)&(((Value *)local_210._8_8_)->
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           ).
                           super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   + 8);
          *p_Var1 = *p_Var1 + 1;
          UNLOCK();
        }
        else {
          p_Var1 = (_Atomic_word *)
                   ((long)&(((Value *)local_210._8_8_)->
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           ).
                           super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   + 8);
          *p_Var1 = *p_Var1 + 1;
        }
      }
      if ((element_type *)local_210._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_);
      }
      pQVar5 = ::qpdf::BaseHandle::as<QPDF_Dictionary>
                         (&local_178.super_QPDFObjectHelper.oh_.super_BaseHandle);
      if (pQVar5 == (QPDF_Dictionary *)0x0) {
        p_Var7 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var7 = (pQVar5->items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      pQVar5 = ::qpdf::BaseHandle::as<QPDF_Dictionary>
                         (&local_178.super_QPDFObjectHelper.oh_.super_BaseHandle);
      p_Var8 = &(pQVar5->items)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar5 == (QPDF_Dictionary *)0x0) {
        p_Var8 = (_Rb_tree_node_base *)0x0;
      }
      for (; p_Var7 != p_Var8; p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
        __v = *(variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                **)(p_Var7 + 2);
        if (__v != (variant<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    *)0x0) {
          _Var3 = (__v->
                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  ).
                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  .
                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                  ._M_index;
          if (_Var3 == '\x0f') {
            pvVar6 = std::
                     get<15ul,std::monostate,QPDF_Reserved,QPDF_Null,QPDF_Bool,QPDF_Integer,QPDF_Real,QPDF_String,QPDF_Name,QPDF_Array,QPDF_Dictionary,QPDF_Stream,QPDF_Operator,QPDF_InlineImage,QPDF_Unresolved,QPDF_Destroyed,QPDF_Reference>
                               (__v);
LAB_001805b1:
            _Var3 = *(__index_type *)
                     ((long)&(((pvVar6->obj).
                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             value).
                             super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                             .
                             super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                     + 0x30);
          }
          else if (_Var3 == '\r') {
            pvVar6 = (variant_alternative_t<15UL,_variant<monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>_>
                      *)QPDF::resolve(*(QPDF **)((long)&__v[1].
                                                  super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  .
                                                  super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                                  ._M_u + 0x10),
                                      *(QPDFObjGen *)
                                       ((long)&__v[1].
                                               super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                               .
                                               super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                               .
                                               super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                               .
                                               super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                               .
                                               super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                               .
                                               super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                               ._M_u + 0x18));
            goto LAB_001805b1;
          }
          if (_Var3 != '\x02') {
            local_178.m.
            super___shared_ptr<QPDFFileSpecObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = *(element_type **)(p_Var7 + 2);
            local_178.m.
            super___shared_ptr<QPDFFileSpecObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7[2]._M_parent;
            if ((_Base_ptr)
                local_178.m.
                super___shared_ptr<QPDFFileSpecObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Base_ptr)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&((_Base_ptr)
                         local_178.m.
                         super___shared_ptr<QPDFFileSpecObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_parent =
                     *(int *)&((_Base_ptr)
                              local_178.m.
                              super___shared_ptr<QPDFFileSpecObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_M_parent + 1;
                UNLOCK();
              }
              else {
                *(int *)&((_Base_ptr)
                         local_178.m.
                         super___shared_ptr<QPDFFileSpecObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi)->_M_parent =
                     *(int *)&((_Base_ptr)
                              local_178.m.
                              super___shared_ptr<QPDFFileSpecObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi)->_M_parent + 1;
              }
            }
            QPDFEFStreamObjectHelper::QPDFEFStreamObjectHelper
                      ((QPDFEFStreamObjectHelper *)local_210,(QPDFObjectHandle *)&local_178.m);
            if ((_Base_ptr)
                local_178.m.
                super___shared_ptr<QPDFFileSpecObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_178.m.
                         super___shared_ptr<QPDFFileSpecObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            JSON::makeDictionary();
            JSON::addDictionaryMember((JSON *)(local_198 + 0x10),&local_120,(JSON *)(p_Var7 + 1));
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_string_length)
              ;
            }
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"creationdate","");
            QPDFEFStreamObjectHelper::getCreationDate_abi_cxx11_
                      (&local_1d0,(QPDFEFStreamObjectHelper *)local_210);
            local_250._0_8_ = local_250 + 0x10;
            local_250._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_250[0x10] = '\0';
            QUtil::pdf_time_to_iso8601(&local_1d0,(string *)local_250);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              JSON::makeNull();
            }
            else {
              JSON::makeString(&local_1b0,(string *)local_250);
            }
            JSON::addDictionaryMember(&local_e0,(string *)(local_198 + 0x10),(JSON *)&local_230);
            if (local_e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_1b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((element_type *)local_250._0_8_ != (element_type *)(local_250 + 0x10)) {
              operator_delete((void *)local_250._0_8_,CONCAT71(local_250._17_7_,local_250[0x10]) + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_230,"modificationdate","");
            QPDFEFStreamObjectHelper::getCreationDate_abi_cxx11_
                      (&local_1d0,(QPDFEFStreamObjectHelper *)local_210);
            local_250._0_8_ = local_250 + 0x10;
            local_250._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_250[0x10] = '\0';
            QUtil::pdf_time_to_iso8601(&local_1d0,(string *)local_250);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              JSON::makeNull();
            }
            else {
              JSON::makeString(&local_1b0,(string *)local_250);
            }
            JSON::addDictionaryMember(&local_f0,(string *)(local_198 + 0x10),(JSON *)&local_230);
            if (local_f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_1b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((element_type *)local_250._0_8_ != (element_type *)(local_250 + 0x10)) {
              operator_delete((void *)local_250._0_8_,CONCAT71(local_250._17_7_,local_250[0x10]) + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"mimetype","");
            QPDFEFStreamObjectHelper::getSubtype_abi_cxx11_
                      ((string *)local_250,(QPDFEFStreamObjectHelper *)local_210);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              JSON::makeNull();
            }
            else {
              JSON::makeString((JSON *)&local_1d0,(string *)local_250);
            }
            JSON::addDictionaryMember(&local_100,(string *)(local_198 + 0x10),(JSON *)&local_230);
            if (local_100.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length)
              ;
            }
            if ((element_type *)local_250._0_8_ != (element_type *)(local_250 + 0x10)) {
              operator_delete((void *)local_250._0_8_,CONCAT71(local_250._17_7_,local_250[0x10]) + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"checksum","");
            QPDFEFStreamObjectHelper::getChecksum_abi_cxx11_
                      (&local_1d0,(QPDFEFStreamObjectHelper *)local_210);
            QUtil::hex_encode((string *)local_250,&local_1d0);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250._8_8_ ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              JSON::makeNull();
            }
            else {
              JSON::makeString(&local_1b0,(string *)local_250);
            }
            JSON::addDictionaryMember
                      ((JSON *)&local_120.field_2,(string *)(local_198 + 0x10),(JSON *)&local_230);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120.field_2._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120.field_2._8_8_);
            }
            if (local_1b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((element_type *)local_250._0_8_ != (element_type *)(local_250 + 0x10)) {
              operator_delete((void *)local_250._0_8_,CONCAT71(local_250._17_7_,local_250[0x10]) + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._24_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._24_8_);
            }
            QPDFEFStreamObjectHelper::~QPDFEFStreamObjectHelper
                      ((QPDFEFStreamObjectHelper *)local_210);
          }
        }
      }
      if ((element_type *)
          local_178.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      _Var2._M_pi = local_178.super_QPDFObjectHelper.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_string_length);
      }
      if (local_178.super_QPDFObjectHelper.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_178.super_QPDFObjectHelper.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
      }
      if (local_1a0 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0);
      }
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)_Var2._M_pi);
    } while ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
             &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
  ::~_Rb_tree(&local_60);
  local_210._0_8_ = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"attachments","");
  JSON::writeDictionaryItem
            ((Pipeline *)local_140.field_2._M_allocated_capacity,(bool *)local_140.field_2._8_8_,
             (string *)local_210,(JSON *)&local_140,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._0_8_ != local_200) {
    operator_delete((void *)local_210._0_8_,local_200[0]._M_allocated_capacity + 1);
  }
  QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper(&local_80);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._M_string_length);
  }
  return;
}

Assistant:

void
QPDFJob::doJSONAttachments(Pipeline* p, bool& first, QPDF& pdf)
{
    auto to_iso8601 = [](std::string const& d) {
        // Convert PDF date to iso8601 if not empty; if empty, return
        // empty.
        std::string iso8601;
        QUtil::pdf_time_to_iso8601(d, iso8601);
        return iso8601;
    };

    auto null_or_string = [](std::string const& s) {
        if (s.empty()) {
            return JSON::makeNull();
        } else {
            return JSON::makeString(s);
        }
    };

    JSON j_attachments = JSON::makeDictionary();
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    for (auto const& iter: efdh.getEmbeddedFiles()) {
        std::string const& key = iter.first;
        auto fsoh = iter.second;
        auto j_details = j_attachments.addDictionaryMember(key, JSON::makeDictionary());
        j_details.addDictionaryMember(
            "filespec", JSON::makeString(fsoh->getObjectHandle().unparse()));
        j_details.addDictionaryMember("preferredname", JSON::makeString(fsoh->getFilename()));
        j_details.addDictionaryMember(
            "preferredcontents", JSON::makeString(fsoh->getEmbeddedFileStream().unparse()));
        j_details.addDictionaryMember("description", null_or_string(fsoh->getDescription()));
        auto j_names = j_details.addDictionaryMember("names", JSON::makeDictionary());
        for (auto const& i2: fsoh->getFilenames()) {
            j_names.addDictionaryMember(i2.first, JSON::makeString(i2.second));
        }
        auto j_streams = j_details.addDictionaryMember("streams", JSON::makeDictionary());
        for (auto const& [key2, value2]: fsoh->getEmbeddedFileStreams().as_dictionary()) {
            if (value2.null()) {
                continue;
            }
            auto efs = QPDFEFStreamObjectHelper(value2);
            auto j_stream = j_streams.addDictionaryMember(key2, JSON::makeDictionary());
            j_stream.addDictionaryMember(
                "creationdate", null_or_string(to_iso8601(efs.getCreationDate())));
            j_stream.addDictionaryMember(
                "modificationdate", null_or_string(to_iso8601(efs.getCreationDate())));
            j_stream.addDictionaryMember("mimetype", null_or_string(efs.getSubtype()));
            j_stream.addDictionaryMember(
                "checksum", null_or_string(QUtil::hex_encode(efs.getChecksum())));
        }
    }
    JSON::writeDictionaryItem(p, first, "attachments", j_attachments, 1);
}